

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O1

void __thiscall
capnp::UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader
          (UnalignedFlatArrayMessageReader *this,ArrayPtr<const_capnp::word> array,
          ReaderOptions options)

{
  Array<kj::ArrayPtr<const_capnp::word>_> *pAVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  word *pwVar10;
  ulong uVar11;
  long lVar12;
  ReaderOptions options_00;
  Fault f;
  Fault local_58;
  size_t local_50;
  ArrayDisposer *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar7 = array.size_;
  pwVar10 = array.ptr;
  options_00._8_8_ = options._8_8_ & 0xffffffff;
  options_00.traversalLimitInWords = options.traversalLimitInWords;
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__UnalignedFlatArrayMessageReader_00649ad8;
  (this->segment0).ptr = (word *)0x0;
  (this->segment0).size_ = 0;
  (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
  (this->moreSegments).size_ = 0;
  (this->moreSegments).disposer = (ArrayDisposer *)0x0;
  this->end = pwVar10 + uVar7;
  if (uVar7 != 0) {
    pAVar1 = &this->moreSegments;
    uVar8 = (uint)pwVar10->content;
    uVar11 = (ulong)uVar8;
    uVar8 = uVar8 + 1;
    uVar6 = (ulong)((uVar8 >> 1) + 1);
    if (uVar7 < uVar6) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                (&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                 ,0x2b,FAILED,"array.size() >= offset",
                 "\"Message ends prematurely in segment table.\"",
                 (char (*) [43])"Message ends prematurely in segment table.");
      kj::_::Debug::Fault::~Fault(&local_58);
    }
    else {
      uVar5 = (ulong)*(uint *)((long)&pwVar10->content + 4);
      uVar9 = uVar5 + uVar6;
      if (uVar7 < uVar9) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                  (&local_58,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                   ,0x33,FAILED,"array.size() >= offset + segmentSize",
                   "\"Message ends prematurely in first segment.\"",
                   (char (*) [43])"Message ends prematurely in first segment.");
        kj::_::Debug::Fault::~Fault(&local_58);
      }
      else {
        (this->segment0).ptr = pwVar10 + uVar6;
        (this->segment0).size_ = uVar5;
        if (1 < uVar8) {
          local_58.exception =
               (Exception *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (0x10,uVar11,uVar11,
                          kj::_::HeapArrayDisposer::
                          Allocate_<kj::ArrayPtr<const_capnp::word>,_false,_false>::construct,
                          kj::_::HeapArrayDisposer::
                          Allocate_<kj::ArrayPtr<const_capnp::word>,_false,_false>::destruct);
          local_48 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
          pAVar2 = pAVar1->ptr;
          local_50 = uVar11;
          if (pAVar2 != (ArrayPtr<const_capnp::word> *)0x0) {
            sVar3 = (this->moreSegments).size_;
            pAVar1->ptr = (ArrayPtr<const_capnp::word> *)0x0;
            (this->moreSegments).size_ = 0;
            pAVar4 = (this->moreSegments).disposer;
            (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pAVar2,0x10,sVar3,sVar3,0);
          }
          (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)local_58.exception;
          (this->moreSegments).size_ = local_50;
          local_40 = (ulong)uVar8;
          local_38 = (ulong)(uVar8 + (uVar8 == 0));
          (this->moreSegments).disposer = local_48;
          lVar12 = 8;
          uVar6 = 1;
          do {
            uVar11 = uVar6;
            if (local_38 == uVar11) break;
            uVar6 = (ulong)*(uint *)((long)&pwVar10->content + uVar11 * 4 + 4);
            uVar5 = uVar9 + uVar6;
            if (uVar7 < uVar5) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                        (&local_58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                         ,0x41,FAILED,"array.size() >= offset + segmentSize",
                         "\"Message ends prematurely.\"",(char (*) [26])"Message ends prematurely.")
              ;
              pAVar2 = pAVar1->ptr;
              if (pAVar2 != (ArrayPtr<const_capnp::word> *)0x0) {
                sVar3 = (this->moreSegments).size_;
                pAVar1->ptr = (ArrayPtr<const_capnp::word> *)0x0;
                (this->moreSegments).size_ = 0;
                pAVar4 = (this->moreSegments).disposer;
                (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pAVar2,0x10,sVar3,sVar3,0);
              }
              kj::_::Debug::Fault::~Fault(&local_58);
            }
            else {
              pAVar2 = pAVar1->ptr;
              *(word **)((long)pAVar2 + lVar12 + -8) = pwVar10 + uVar9;
              *(ulong *)((long)&pAVar2->ptr + lVar12) = uVar6;
              uVar9 = uVar5;
            }
            lVar12 = lVar12 + 0x10;
            uVar6 = uVar11 + 1;
          } while (uVar5 <= uVar7);
          if (uVar11 < local_40) {
            return;
          }
        }
        this->end = pwVar10 + uVar9;
      }
    }
  }
  return;
}

Assistant:

UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader(
    kj::ArrayPtr<const word> array, ReaderOptions options)
    : MessageReader(options), end(array.end()) {
  if (array.size() < 1) {
    // Assume empty message.
    return;
  }

  const _::WireValue<uint32_t>* table =
      reinterpret_cast<const _::WireValue<uint32_t>*>(array.begin());

  uint segmentCount = table[0].get() + 1;
  size_t offset = segmentCount / 2u + 1u;

  KJ_REQUIRE(array.size() >= offset, "Message ends prematurely in segment table.") {
    return;
  }

  {
    uint segmentSize = table[1].get();

    KJ_REQUIRE(array.size() >= offset + segmentSize,
               "Message ends prematurely in first segment.") {
      return;
    }

    segment0 = array.slice(offset, offset + segmentSize);
    offset += segmentSize;
  }

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);

    for (uint i = 1; i < segmentCount; i++) {
      uint segmentSize = table[i + 1].get();

      KJ_REQUIRE(array.size() >= offset + segmentSize, "Message ends prematurely.") {
        moreSegments = nullptr;
        return;
      }

      moreSegments[i - 1] = array.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  end = array.begin() + offset;
}